

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall tetgenio::load_tet(tetgenio *this,char *filebasename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  FILE *__stream;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  double *pdVar7;
  int local_c4c;
  int local_c48;
  int j;
  int i;
  int attribindex;
  int index;
  int corner;
  double attrib;
  char *stringptr;
  char inputline [2048];
  char infilename [1024];
  FILE *infile;
  char *filebasename_local;
  tetgenio *this_local;
  
  strcpy(inputline + 0x7f8,filebasename);
  strcat(inputline + 0x7f8,".ele");
  __stream = fopen(inputline + 0x7f8,"r");
  if (__stream == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    printf("Opening %s.\n",inputline + 0x7f8);
    attrib = (double)readnumberline(this,(char *)&stringptr,(FILE *)__stream,inputline + 0x7f8);
    lVar4 = strtol((char *)attrib,(char **)&attrib,0);
    this->numberoftetrahedra = (int)lVar4;
    if (this->numberoftetrahedra < 1) {
      printf("Error:  Invalid number of tetrahedra.\n");
      fclose(__stream);
      this_local._7_1_ = false;
    }
    else {
      attrib = (double)findnextnumber(this,(char *)attrib);
      if (*(char *)attrib == '\0') {
        this->numberofcorners = 4;
      }
      else {
        lVar4 = strtol((char *)attrib,(char **)&attrib,0);
        this->numberofcorners = (int)lVar4;
      }
      attrib = (double)findnextnumber(this,(char *)attrib);
      if (*(char *)attrib == '\0') {
        this->numberoftetrahedronattributes = 0;
      }
      else {
        lVar4 = strtol((char *)attrib,(char **)&attrib,0);
        this->numberoftetrahedronattributes = (int)lVar4;
      }
      if ((this->numberofcorners == 4) || (this->numberofcorners == 10)) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(this->numberoftetrahedra * this->numberofcorners);
        uVar5 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        piVar6 = (int *)operator_new__(uVar5);
        this->tetrahedronlist = piVar6;
        if (this->tetrahedronlist == (int *)0x0) {
          terminatetetgen((tetgenmesh *)0x0,1);
        }
        if (0 < this->numberoftetrahedronattributes) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)(this->numberoftetrahedra * this->numberoftetrahedronattributes);
          uVar5 = SUB168(auVar2 * ZEXT816(8),0);
          if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
            uVar5 = 0xffffffffffffffff;
          }
          pdVar7 = (double *)operator_new__(uVar5);
          this->tetrahedronattributelist = pdVar7;
          if (this->tetrahedronattributelist == (double *)0x0) {
            terminatetetgen((tetgenmesh *)0x0,1);
          }
        }
        i = 0;
        j = 0;
        for (local_c48 = 0; local_c48 < this->numberoftetrahedra; local_c48 = local_c48 + 1) {
          attrib = (double)readnumberline(this,(char *)&stringptr,(FILE *)__stream,inputline + 0x7f8
                                         );
          for (local_c4c = 0; local_c4c < this->numberofcorners; local_c4c = local_c4c + 1) {
            attrib = (double)findnextnumber(this,(char *)attrib);
            if (*(char *)attrib == '\0') {
              printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
                     (ulong)(uint)(local_c48 + this->firstnumber),(ulong)(local_c4c + 1),
                     inputline + 0x7f8);
              terminatetetgen((tetgenmesh *)0x0,1);
            }
            lVar4 = strtol((char *)attrib,(char **)&attrib,0);
            iVar3 = (int)lVar4;
            if ((iVar3 < this->firstnumber) || (this->numberofpoints + this->firstnumber <= iVar3))
            {
              printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
                     (ulong)(uint)(local_c48 + this->firstnumber));
              terminatetetgen((tetgenmesh *)0x0,1);
            }
            this->tetrahedronlist[i] = iVar3;
            i = i + 1;
          }
          for (local_c4c = 0; local_c4c < this->numberoftetrahedronattributes;
              local_c4c = local_c4c + 1) {
            attrib = (double)findnextnumber(this,(char *)attrib);
            if (*(char *)attrib == '\0') {
              _index = 0.0;
            }
            else {
              _index = strtod((char *)attrib,(char **)&attrib);
            }
            this->tetrahedronattributelist[j] = _index;
            j = j + 1;
          }
        }
        fclose(__stream);
        this_local._7_1_ = true;
      }
      else {
        printf("Error:  Wrong number of corners %d (should be 4 or 10).\n",
               (ulong)(uint)this->numberofcorners);
        fclose(__stream);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool tetgenio::load_tet(char* filebasename)
{
  FILE *infile;
  char infilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL attrib;
  int corner;
  int index, attribindex;
  int i, j;

  strcpy(infilename, filebasename);
  strcat(infilename, ".ele");

  infile = fopen(infilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", infilename);
  } else {
    return false;
  }

  // Read number of elements, number of corners (4 or 10), number of
  //   element attributes.
  stringptr = readnumberline(inputline, infile, infilename);
  numberoftetrahedra = (int) strtol (stringptr, &stringptr, 0);
  if (numberoftetrahedra <= 0) {
    printf("Error:  Invalid number of tetrahedra.\n");
    fclose(infile);
    return false;
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberofcorners = 4;  // Default read 4 nodes per element.
  } else {
    numberofcorners = (int) strtol(stringptr, &stringptr, 0);
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberoftetrahedronattributes = 0; // Default no attribute.
  } else {
    numberoftetrahedronattributes = (int) strtol(stringptr, &stringptr, 0);
  }
  if (numberofcorners != 4 && numberofcorners != 10) {
    printf("Error:  Wrong number of corners %d (should be 4 or 10).\n", 
           numberofcorners);
    fclose(infile);
    return false;
  }

  // Allocate memory for tetrahedra.
  tetrahedronlist = new int[numberoftetrahedra * numberofcorners]; 
  if (tetrahedronlist == (int *) NULL) {
    terminatetetgen(NULL, 1);
  }
  // Allocate memory for output tetrahedron attributes if necessary.
  if (numberoftetrahedronattributes > 0) {
    tetrahedronattributelist = new REAL[numberoftetrahedra *
                                        numberoftetrahedronattributes];
    if (tetrahedronattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the list of tetrahedra.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberoftetrahedra; i++) {
    // Read tetrahedron index and the tetrahedron's corners.
    stringptr = readnumberline(inputline, infile, infilename);
    for (j = 0; j < numberofcorners; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
               i + firstnumber, j + 1, infilename);
        terminatetetgen(NULL, 1);
      }
      corner = (int) strtol(stringptr, &stringptr, 0);
      if (corner < firstnumber || corner >= numberofpoints + firstnumber) {
        printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
               i + firstnumber);
        terminatetetgen(NULL, 1);
      }
      tetrahedronlist[index++] = corner;
    }
    // Read the tetrahedron's attributes.
    for (j = 0; j < numberoftetrahedronattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      tetrahedronattributelist[attribindex++] = attrib;
    }
  }

  fclose(infile);

  return true;
}